

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastSR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  ushort uVar2;
  Arena *pAVar3;
  SerialArena *this;
  __int_type_conflict3 _Var4;
  bool bVar5;
  uint32_t size;
  RepeatedPtrFieldBase *this_00;
  long lVar6;
  string *s;
  char *pcVar7;
  uint *puVar8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 s_00;
  uint uVar9;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  ulong uVar10;
  ParseContext *ctx_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 ptr_00;
  size_t offset;
  anon_class_24_3_e6152a34 validate_last_string;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_50;
  anon_class_24_3_e6152a34 local_48;
  
  if (data.field_0._0_2_ != 0) {
    pcVar7 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  uVar1 = *(ushort *)ptr;
  s_00 = data.field_0 >> 0x30;
  ptr_00.data = s_00.data;
  this_00 = &RefAt<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(msg,s_00.data)->
             super_RepeatedPtrFieldBase;
  pAVar3 = this_00->arena_;
  local_48.expected_tag = uVar1;
  local_48.table = table;
  local_48.field =
       (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)this_00;
  if (pAVar3 != (Arena *)0x0) {
    lVar6 = __tls_get_addr(&PTR_004b29d8);
    s_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(lVar6 + 8))->data;
    if ((ushort *)s_00.data == (ushort *)(pAVar3->impl_).tag_and_id_) {
      this = *(SerialArena **)(lVar6 + 0x10);
      bVar5 = RepeatedPtrFieldBase::PrepareForParse(this_00);
      if (bVar5) {
        do {
          local_50.data = (long)ptr + 2;
          size = ReadSize((char **)&local_50);
          ctx_00 = extraout_RDX;
          if ((ushort *)local_50.data == (ushort *)0x0) goto LAB_00267773;
          _Var4 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
          if (_Var4 == 0) {
            s_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   SerialArena::AllocateFromStringBlockFallback(this);
          }
          else {
            offset = _Var4 - 0x20;
            (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = offset;
            s_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   StringBlock::AtOffset_abi_cxx11_((this->string_block_)._M_b._M_p,offset);
          }
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)s_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(s_00.data + 0x10);
          *(size_type *)(s_00.data + 8) = 0;
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(s_00.data + 0x10))->_M_local_buf[0] = '\0';
          RepeatedPtrFieldBase::AddAllocatedForParse(this_00,(void *)s_00);
          ptr_00 = local_50;
          ptr = EpsCopyInputStream::ReadString
                          (&ctx->super_EpsCopyInputStream,(char *)local_50,size,(string *)s_00);
          ctx_00 = extraout_RDX_00;
          if (((ushort *)ptr == (ushort *)0x0) ||
             (bVar5 = RepeatedString<unsigned_short,_google::protobuf::RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(google::protobuf::internal::TcParser::Utf8Type)2>
                      ::anon_class_24_3_e6152a34::operator()(&local_48), ctx_00 = extraout_RDX_01,
             !bVar5)) goto LAB_00267773;
          s_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 (ctx->super_EpsCopyInputStream).limit_end_;
          if (s_00.data <= ptr) goto LAB_00267741;
          uVar2 = *(ushort *)ptr;
        } while (uVar2 == uVar1);
        goto LAB_002676f8;
      }
    }
  }
  do {
    ptr_00.data = (long)ptr + 2;
    s = (string *)RepeatedPtrFieldBase::AddString(this_00);
    ptr = InlineGreedyStringParser(s,(char *)ptr_00,ctx);
    ctx_00 = extraout_RDX_02;
    if (((ushort *)ptr == (ushort *)0x0) ||
       (bVar5 = RepeatedString<unsigned_short,_google::protobuf::RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(google::protobuf::internal::TcParser::Utf8Type)2>
                ::anon_class_24_3_e6152a34::operator()(&local_48), ctx_00 = extraout_RDX_03, !bVar5)
       ) {
LAB_00267773:
      pcVar7 = Error(msg,(char *)ptr_00,ctx_00,(TcFieldData)s_00,table,hasbits);
      return pcVar7;
    }
    s_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(ctx->super_EpsCopyInputStream).limit_end_;
    if (s_00.data <= ptr) goto LAB_00267741;
    uVar2 = *(ushort *)ptr;
  } while (uVar2 == uVar1);
LAB_002676f8:
  if (ptr < s_00.data) {
    uVar9 = (uint)table->fast_idx_mask & (uint)uVar2;
    if ((uVar9 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    uVar10 = (ulong)(uVar9 & 0xfffffff8);
    pcVar7 = (char *)(**(code **)(&table[1].has_bits_offset + uVar10))
                               (msg,ptr,ctx,
                                (ulong)(uint)uVar2 ^
                                *(ulong *)(&table[1].fast_idx_mask + uVar10 * 2),table,hasbits);
    return pcVar7;
  }
LAB_00267741:
  if (table->has_bits_offset != 0) {
    puVar8 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar8 = *puVar8 | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastSR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedString<
      uint16_t, RepeatedPtrField<std::string>, kUtf8ValidateOnly>(
      PROTOBUF_TC_PARAM_PASS);
}